

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack26_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1a;
  *puVar1 = (in[1] & 0xfffff) << 6 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x14;
  *puVar1 = (in[2] & 0x3fff) << 0xc | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0xe;
  *puVar1 = (in[3] & 0xff) << 0x12 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 8;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 3) << 0x18 | *puVar1;
  out[5] = *puVar2 >> 2 & 0x3ffffff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[5] & 0x3fffff) << 4 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[5] >> 0x16;
  *puVar1 = (in[6] & 0xffff) << 10 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[6] >> 0x10;
  *puVar1 = (in[7] & 0x3ff) << 0x10 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[7] >> 10;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0xf) << 0x16 | *puVar1;
  out[10] = *puVar2 >> 4 & 0x3ffffff;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[9] & 0xffffff) << 2 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[9] >> 0x18;
  *puVar1 = (in[10] & 0x3ffff) << 8 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[10] >> 0x12;
  *puVar1 = (in[0xb] & 0xfff) << 0xe | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xb] >> 0xc;
  *puVar1 = (in[0xc] & 0x3f) << 0x14 | *puVar1;
  out[0xf] = in[0xc] >> 6;
  out[0x10] = in[0xd] & 0x3ffffff;
  puVar1 = out + 0x11;
  *puVar1 = in[0xd] >> 0x1a;
  *puVar1 = (in[0xe] & 0xfffff) << 6 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xe] >> 0x14;
  *puVar1 = (in[0xf] & 0x3fff) << 0xc | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0xf] >> 0xe;
  *puVar1 = (in[0x10] & 0xff) << 0x12 | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x10] >> 8;
  puVar2 = in + 0x11;
  *puVar1 = (*puVar2 & 3) << 0x18 | *puVar1;
  out[0x15] = *puVar2 >> 2 & 0x3ffffff;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0x12] & 0x3fffff) << 4 | *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x12] >> 0x16;
  *puVar1 = (in[0x13] & 0xffff) << 10 | *puVar1;
  return in + 0x14;
}

Assistant:

const uint32_t *__fastunpack26_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;

  return in + 1;
}